

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O2

void __thiscall
boost::asio::detail::op_queue<boost::asio::detail::scheduler_operation>::
push<boost::asio::detail::reactor_op>
          (op_queue<boost::asio::detail::scheduler_operation> *this,
          op_queue<boost::asio::detail::reactor_op> *q)

{
  scheduler_operation *psVar1;
  
  if (*(scheduler_operation **)q != (scheduler_operation *)0x0) {
    psVar1 = this->back_;
    if (this->back_ == (scheduler_operation *)0x0) {
      psVar1 = (scheduler_operation *)this;
    }
    psVar1->next_ = *(scheduler_operation **)q;
    this->back_ = *(scheduler_operation **)(q + 8);
    *(undefined8 *)q = 0;
    *(undefined8 *)(q + 8) = 0;
  }
  return;
}

Assistant:

void push(op_queue<OtherOperation>& q)
  {
    if (Operation* other_front = op_queue_access::front(q))
    {
      if (back_)
        op_queue_access::next(back_, other_front);
      else
        front_ = other_front;
      back_ = op_queue_access::back(q);
      op_queue_access::front(q) = 0;
      op_queue_access::back(q) = 0;
    }
  }